

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.h
# Opt level: O2

uint8_t * google::protobuf::internal::WireFormatLite::WriteInt64ToArrayWithField<3>
                    (EpsCopyOutputStream *stream,int64_t value,uint8_t *target)

{
  uint8_t *puVar1;
  
  puVar1 = io::EpsCopyOutputStream::EnsureSpace(stream,target);
  puVar1 = WriteInt64ToArray(3,value,puVar1);
  return puVar1;
}

Assistant:

PROTOBUF_NOINLINE static uint8_t* WriteInt64ToArrayWithField(
      ::google::protobuf::io::EpsCopyOutputStream* stream, int64_t value,
      uint8_t* target) {
    target = stream->EnsureSpace(target);
    return WriteInt64ToArray(field_number, value, target);
  }